

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellCommand.cpp
# Opt level: O1

void __thiscall
llbuild::buildsystem::ShellCommand::processDependencyInfoDiscoveredDependencies::DepsActions::error
          (DepsActions *this,char *message,uint64_t position)

{
  char *pcVar1;
  BuildSystemDelegate *pBVar2;
  long *plVar3;
  undefined8 *puVar4;
  long *plVar5;
  ulong *puVar6;
  ulong uVar7;
  allocator local_d9;
  ulong *local_d8;
  long local_d0;
  ulong local_c8;
  long lStack_c0;
  long *local_b8;
  undefined8 local_b0;
  long local_a8;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  ShellCommand *local_98;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  pBVar2 = BuildSystem::getDelegate(this->system);
  local_98 = this->command;
  pcVar1 = (this->depsPath).Data;
  local_70 = &local_60;
  if (pcVar1 == (char *)0x0) {
    local_68 = 0;
    local_60 = 0;
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,pcVar1,pcVar1 + (this->depsPath).Length);
  }
  plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x1a4ec5);
  plVar5 = plVar3 + 2;
  if ((long *)*plVar3 == plVar5) {
    local_40 = *plVar5;
    lStack_38 = plVar3[3];
    local_50 = &local_40;
  }
  else {
    local_40 = *plVar5;
    local_50 = (long *)*plVar3;
  }
  local_48 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
  puVar6 = (ulong *)(plVar3 + 2);
  if ((ulong *)*plVar3 == puVar6) {
    local_c8 = *puVar6;
    lStack_c0 = plVar3[3];
    local_d8 = &local_c8;
  }
  else {
    local_c8 = *puVar6;
    local_d8 = (ulong *)*plVar3;
  }
  local_d0 = plVar3[1];
  *plVar3 = (long)puVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::string((string *)&local_90,message,&local_d9);
  uVar7 = 0xf;
  if (local_d8 != &local_c8) {
    uVar7 = local_c8;
  }
  if (uVar7 < (ulong)(local_88 + local_d0)) {
    uVar7 = 0xf;
    if (local_90 != local_80) {
      uVar7 = local_80[0];
    }
    if ((ulong)(local_88 + local_d0) <= uVar7) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_d8);
      goto LAB_00138e76;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_90);
LAB_00138e76:
  local_b8 = &local_a8;
  plVar3 = puVar4 + 2;
  if ((long *)*puVar4 == plVar3) {
    local_a8 = *plVar3;
    uStack_a0 = *(undefined4 *)(puVar4 + 3);
    uStack_9c = *(undefined4 *)((long)puVar4 + 0x1c);
  }
  else {
    local_a8 = *plVar3;
    local_b8 = (long *)*puVar4;
  }
  local_b0 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)plVar3 = 0;
  (*pBVar2->_vptr_BuildSystemDelegate[0xb])(pBVar2,local_98,local_b8,local_b0);
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,local_a8 + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,local_c8 + 1);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
  }
  this->numErrors = this->numErrors + 1;
  return;
}

Assistant:

virtual void error(const char* message, uint64_t position) override {
      system.getDelegate().commandHadError(
          command, ("error reading dependency file '" + depsPath.str() +
                    "': " + std::string(message)));
      ++numErrors;
    }